

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O2

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  undefined4 *puVar1;
  __mxxxi *palVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  AlignmentSubtype AVar6;
  AlignmentType AVar7;
  pointer ppNVar8;
  pointer ppNVar9;
  __mxxxi *palVar10;
  Node *pNVar11;
  pointer ppEVar12;
  long lVar13;
  undefined1 auVar14 [32];
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  char cVar18;
  Implementation *pIVar20;
  int iVar21;
  int iVar22;
  const_iterator __begin4;
  ulong uVar23;
  pointer ppEVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  long lVar29;
  byte bVar30;
  uint uVar31;
  const_iterator __end4;
  ulong uVar32;
  bool bVar33;
  __mxxxi alVar34;
  undefined1 auVar35 [32];
  type unpacked [16];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  short sVar19;
  
  bVar3 = (this->super_AlignmentEngine).m_;
  bVar27 = (this->super_AlignmentEngine).n_;
  bVar26 = (this->super_AlignmentEngine).q_;
  bVar25 = (char)bVar3 >> 7;
  bVar30 = (char)bVar26 >> 7;
  bVar25 = (bVar3 ^ bVar25) - bVar25;
  bVar30 = (bVar26 ^ bVar30) - bVar30;
  bVar26 = (char)bVar27 >> 7;
  bVar26 = (bVar27 ^ bVar26) - bVar26;
  bVar3 = (this->super_AlignmentEngine).g_;
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  bVar27 = (char)bVar3 >> 7;
  bVar27 = (bVar3 ^ bVar27) - bVar27;
  if (bVar26 < bVar25) {
    bVar26 = bVar25;
  }
  if (bVar30 < bVar27) {
    bVar30 = bVar27;
  }
  if (bVar30 < bVar26) {
    bVar30 = bVar26;
  }
  for (uVar23 = 0; uVar23 < graph->num_codes_; uVar23 = uVar23 + 1) {
    uVar31 = 0;
    iVar21 = (graph->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar23 & 0xff];
    for (uVar28 = 0; uVar28 < matrix_width; uVar28 = uVar28 + 1) {
      cVar4 = (this->super_AlignmentEngine).m_;
      cVar5 = (this->super_AlignmentEngine).n_;
      uVar32 = (ulong)uVar31;
      for (lVar29 = 0; lVar29 != 0x20; lVar29 = lVar29 + 2) {
        sVar19 = -(ushort)bVar30;
        if (uVar32 < normal_matrix_width) {
          cVar18 = cVar4;
          if (sequence[uVar32] != (char)iVar21) {
            cVar18 = cVar5;
          }
          sVar19 = (short)cVar18;
        }
        *(short *)((long)&local_80 + lVar29) = sVar19;
        uVar32 = uVar32 + 1;
      }
      uVar31 = uVar31 + 0x10;
      palVar10 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->sequence_profile + uVar23 * matrix_width + (ulong)uVar28;
      (*palVar10)[0] = local_80;
      (*palVar10)[1] = lStack_78;
      (*palVar10)[2] = lStack_70;
      (*palVar10)[3] = lStack_68;
    }
  }
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pIVar20 = (this->pimpl_)._M_t.
            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            ._M_t.
            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
            .
            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
            ._M_head_impl;
  for (uVar28 = 0; (ulong)uVar28 < (ulong)((long)ppNVar9 - (long)ppNVar8 >> 3); uVar28 = uVar28 + 1)
  {
    *(uint *)(*(long *)&(pIVar20->node_id_to_rank).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> +
             (ulong)ppNVar8[uVar28]->id * 4) = uVar28;
  }
  AVar6 = (this->super_AlignmentEngine).subtype_;
  if (AVar6 != kAffine) {
    if (AVar6 != kConvex) goto LAB_001194c6;
    uVar23 = 1;
    uVar28 = 0;
    while( true ) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      uVar32 = (ulong)uVar28;
      if (matrix_width <= uVar32) break;
      palVar10 = pIVar20->O + uVar32;
      (*palVar10)[0] = -0x7bff7bff7bff7c00;
      (*palVar10)[1] = -0x7bff7bff7bff7c00;
      (*palVar10)[2] = -0x7bff7bff7bff7c00;
      (*palVar10)[3] = -0x7bff7bff7bff7c00;
      alVar34 = (__mxxxi)vpbroadcastw_avx512vl();
      ((this->pimpl_)._M_t.
       super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       ._M_t.
       super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
       .
       super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
      ._M_head_impl)->Q[uVar32] = alVar34;
      auVar35 = vpbroadcastw_avx512vl();
      iVar21 = 0xf;
      while (bVar33 = iVar21 != 0, iVar21 = iVar21 + -1, bVar33) {
        auVar14 = vperm2i128_avx2(auVar35,auVar35,0x28);
        auVar35 = vpalignr_avx2(auVar35,auVar14,0xe);
        palVar10 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->Q;
        alVar34 = (__mxxxi)vpaddw_avx2(auVar35,(undefined1  [32])palVar10[uVar32]);
        palVar10[uVar32] = alVar34;
      }
      uVar28 = uVar28 + 1;
    }
    puVar1 = (undefined4 *)
             (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl + matrix_height * 8);
    *puVar1 = 0;
    ppNVar8 = (graph->rank_to_node_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
      pNVar11 = ppNVar8[(int)uVar23 - 1];
      ppEVar24 = (pNVar11->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar12 = *(pointer *)
                  ((long)&(pNVar11->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      iVar22 = (int)(this->super_AlignmentEngine).c_;
      iVar21 = (this->super_AlignmentEngine).q_ - iVar22;
      if (ppEVar24 != ppEVar12) {
        iVar21 = -0x7c00;
      }
      for (; ppEVar24 != ppEVar12; ppEVar24 = ppEVar24 + 1) {
        if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          + (ulong)(*ppEVar24)->tail->id * 4) + 1]) {
          iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                  + (ulong)(*ppEVar24)->tail->id * 4) + 1];
        }
      }
      puVar1[uVar23] = iVar21 + iVar22;
    }
  }
  uVar28 = 0;
  while( true ) {
    pIVar20 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    uVar23 = (ulong)uVar28;
    if (matrix_width <= uVar23) break;
    palVar10 = pIVar20->F + uVar23;
    (*palVar10)[0] = -0x7bff7bff7bff7c00;
    (*palVar10)[1] = -0x7bff7bff7bff7c00;
    (*palVar10)[2] = -0x7bff7bff7bff7c00;
    (*palVar10)[3] = -0x7bff7bff7bff7c00;
    alVar34 = (__mxxxi)vpbroadcastw_avx512vl();
    ((this->pimpl_)._M_t.
     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
     ._M_t.
     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
     .
     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
    ._M_head_impl)->E[uVar23] = alVar34;
    auVar35 = vpbroadcastw_avx512vl();
    iVar21 = 0xf;
    while (bVar33 = iVar21 != 0, iVar21 = iVar21 + -1, bVar33) {
      auVar14 = vperm2i128_avx2(auVar35,auVar35,0x28);
      auVar35 = vpalignr_avx2(auVar35,auVar14,0xe);
      palVar10 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->E;
      alVar34 = (__mxxxi)vpaddw_avx2(auVar35,(undefined1  [32])palVar10[uVar23]);
      palVar10[uVar23] = alVar34;
    }
    uVar28 = uVar28 + 1;
  }
  puVar1 = (undefined4 *)
           (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data + matrix_height * 4);
  *puVar1 = 0;
  ppNVar8 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (uVar23 = 1; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
    pNVar11 = ppNVar8[(int)uVar23 - 1];
    ppEVar24 = (pNVar11->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar12 = *(pointer *)
                ((long)&(pNVar11->inedges).
                        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                        ._M_impl + 8);
    iVar22 = (int)(this->super_AlignmentEngine).e_;
    iVar21 = (this->super_AlignmentEngine).g_ - iVar22;
    if (ppEVar24 != ppEVar12) {
      iVar21 = -0x7c00;
    }
    for (; ppEVar24 != ppEVar12; ppEVar24 = ppEVar24 + 1) {
      if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        + (ulong)(*ppEVar24)->tail->id * 4) + 1]) {
        iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + (ulong)(*ppEVar24)->tail->id * 4) + 1];
      }
    }
    puVar1[uVar23] = iVar21 + iVar22;
  }
LAB_001194c6:
  AVar7 = (this->super_AlignmentEngine).type_;
  if (AVar7 == kOV) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kConvex) {
      uVar28 = 0;
      while (uVar23 = (ulong)uVar28, uVar23 < matrix_width) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        uVar28 = uVar28 + 1;
        alVar34 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])pIVar20->E[uVar23],
                                        (undefined1  [32])pIVar20->Q[uVar23]);
        pIVar20->H[uVar23] = alVar34;
      }
    }
    else if (AVar6 == kAffine) {
      for (uVar28 = 0; uVar23 = (ulong)uVar28, uVar23 < matrix_width; uVar28 = uVar28 + 1) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar10 = pIVar20->E + uVar23;
        lVar15 = (*palVar10)[1];
        lVar16 = (*palVar10)[2];
        lVar17 = (*palVar10)[3];
        palVar2 = pIVar20->H + uVar23;
        (*palVar2)[0] = (*palVar10)[0];
        (*palVar2)[1] = lVar15;
        (*palVar2)[2] = lVar16;
        (*palVar2)[3] = lVar17;
      }
    }
    else if (AVar6 == kLinear) {
      for (uVar28 = 0; uVar23 = (ulong)uVar28, uVar23 < matrix_width; uVar28 = uVar28 + 1) {
        alVar34 = (__mxxxi)vpbroadcastw_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar23] = alVar34;
        auVar35 = vpbroadcastw_avx512vl();
        iVar21 = 0xf;
        while (bVar33 = iVar21 != 0, iVar21 = iVar21 + -1, bVar33) {
          auVar14 = vperm2i128_avx2(auVar35,auVar35,0x28);
          auVar35 = vpalignr_avx2(auVar35,auVar14,0xe);
          palVar10 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar34 = (__mxxxi)vpaddw_avx2(auVar35,(undefined1  [32])palVar10[uVar23]);
          palVar10[uVar23] = alVar34;
        }
      }
    }
    pIVar20 = (this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
              ._M_head_impl;
    for (uVar28 = 0; uVar28 < matrix_height; uVar28 = uVar28 + 1) {
      *(undefined4 *)
       (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl +
       (ulong)uVar28 * 4) = 0;
    }
  }
  else if (AVar7 == kNW) {
    AVar6 = (this->super_AlignmentEngine).subtype_;
    if (AVar6 == kLinear) {
      puVar1 = (pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      *puVar1 = 0;
      ppNVar8 = (graph->rank_to_node_).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      cVar4 = (this->super_AlignmentEngine).g_;
      for (uVar23 = 1; uVar23 < matrix_height; uVar23 = (ulong)((int)uVar23 + 1)) {
        pNVar11 = ppNVar8[(int)uVar23 - 1];
        ppEVar24 = (pNVar11->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar12 = *(pointer *)
                    ((long)&(pNVar11->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        iVar21 = -0x7c00;
        if (ppEVar24 == ppEVar12) {
          iVar21 = 0;
        }
        for (; ppEVar24 != ppEVar12; ppEVar24 = ppEVar24 + 1) {
          if (iVar21 <= (int)puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + (ulong)(*ppEVar24)->tail->id * 4) + 1])
          {
            iVar21 = puVar1[*(int *)(*(long *)&(pIVar20->node_id_to_rank).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl + (ulong)(*ppEVar24)->tail->id * 4) + 1];
          }
        }
        puVar1[uVar23] = iVar21 + cVar4;
      }
      for (uVar28 = 0; uVar23 = (ulong)uVar28, uVar23 < matrix_width; uVar28 = uVar28 + 1) {
        alVar34 = (__mxxxi)vpbroadcastw_avx512vl();
        ((this->pimpl_)._M_t.
         super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         ._M_t.
         super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
         .
         super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
        ._M_head_impl)->H[uVar23] = alVar34;
        auVar35 = vpbroadcastw_avx512vl();
        iVar21 = 0xf;
        while (bVar33 = iVar21 != 0, iVar21 = iVar21 + -1, bVar33) {
          auVar14 = vperm2i128_avx2(auVar35,auVar35,0x28);
          auVar35 = vpalignr_avx2(auVar35,auVar14,0xe);
          palVar10 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H;
          alVar34 = (__mxxxi)vpaddw_avx2(auVar35,(undefined1  [32])palVar10[uVar23]);
          palVar10[uVar23] = alVar34;
        }
      }
    }
    else if (AVar6 == kConvex) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      for (uVar28 = 0; uVar23 = (ulong)uVar28, uVar23 < matrix_height; uVar28 = uVar28 + 1) {
        lVar13 = *(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl;
        lVar29 = lVar13 + uVar23 * 4;
        iVar21 = *(int *)(lVar29 + matrix_height * 4);
        iVar22 = *(int *)(matrix_height * 8 + lVar29);
        if (iVar22 < iVar21) {
          iVar22 = iVar21;
        }
        *(int *)(lVar13 + uVar23 * 4) = iVar22;
      }
      uVar28 = 0;
      while (uVar23 = (ulong)uVar28, uVar23 < matrix_width) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        uVar28 = uVar28 + 1;
        alVar34 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])pIVar20->E[uVar23],
                                        (undefined1  [32])pIVar20->Q[uVar23]);
        pIVar20->H[uVar23] = alVar34;
      }
    }
    else if (AVar6 == kAffine) {
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      for (uVar28 = 0; uVar28 < matrix_height; uVar28 = uVar28 + 1) {
        puVar1 = (undefined4 *)
                 (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl + (ulong)uVar28 * 4);
        *puVar1 = puVar1[matrix_height];
      }
      for (uVar28 = 0; uVar23 = (ulong)uVar28, uVar23 < matrix_width; uVar28 = uVar28 + 1) {
        pIVar20 = (this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                  ._M_head_impl;
        palVar10 = pIVar20->E + uVar23;
        lVar15 = (*palVar10)[1];
        lVar16 = (*palVar10)[2];
        lVar17 = (*palVar10)[3];
        palVar2 = pIVar20->H + uVar23;
        (*palVar2)[0] = (*palVar10)[0];
        (*palVar2)[1] = lVar15;
        (*palVar2)[2] = lVar16;
        (*palVar2)[3] = lVar17;
      }
    }
  }
  else if (AVar7 == kSW) {
    uVar28 = 0;
    while( true ) {
      uVar23 = (ulong)uVar28;
      pIVar20 = (this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                ._M_head_impl;
      if (matrix_width <= uVar23) break;
      uVar28 = uVar28 + 1;
      palVar10 = pIVar20->H + uVar23;
      (*palVar10)[0] = 0;
      (*palVar10)[1] = 0;
      (*palVar10)[2] = 0;
      (*palVar10)[3] = 0;
    }
    for (uVar28 = 0; uVar28 < matrix_height; uVar28 = uVar28 + 1) {
      *(undefined4 *)
       (*(long *)&(pIVar20->first_column).super__Vector_base<int,_std::allocator<int>_>._M_impl +
       (ulong)uVar28 * 4) = 0;
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}